

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_regressor.cc
# Opt level: O1

void save_predictor(vw *all,string *reg_name,size_t current_pass)

{
  stringstream filename;
  string local_1c8;
  stringstream local_1a8 [16];
  undefined1 local_198 [376];
  
  std::__cxx11::stringstream::stringstream(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_198,(reg_name->_M_dataplus)._M_p,reg_name->_M_string_length);
  if (all->save_per_pass == true) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_198,".",1);
    std::ostream::_M_insert<unsigned_long>((ulong)local_198);
  }
  std::__cxx11::stringbuf::str();
  dump_regressor(all,&local_1c8,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  std::__cxx11::stringstream::~stringstream(local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
  return;
}

Assistant:

void save_predictor(vw& all, string reg_name, size_t current_pass)
{
  stringstream filename;
  filename << reg_name;
  if (all.save_per_pass)
    filename << "." << current_pass;
  dump_regressor(all, filename.str(), false);
}